

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_sse_on_unsubscribe(void *sse_,void *args_)

{
  long *plVar1;
  
  if (*(code **)((long)args_ + 0x20) != (code *)0x0) {
    (**(code **)((long)args_ + 0x20))(*(undefined8 *)((long)args_ + 0x28));
  }
  fio_free(args_);
  LOCK();
  plVar1 = (long *)((long)sse_ + 0x60);
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    fio_free(sse_);
    return;
  }
  return;
}

Assistant:

static void http_sse_on_unsubscribe(void *sse_, void *args_) {
  http_sse_internal_s *sse = sse_;
  struct http_sse_subscribe_args *args = args_;
  if (args->on_unsubscribe)
    args->on_unsubscribe(args->udata);
  fio_free(args);
  http_sse_try_free(sse);
}